

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::_InternalParse
          (CustomModel_CustomModelParamValue *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  uint32_t value;
  uint64_t uVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar4;
  char cVar5;
  uint32_t tag;
  double *local_40;
  uint local_34;
  
  local_40 = (double *)ptr;
LAB_0028dbb9:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_40);
    if (bVar1) {
      return (char *)local_40;
    }
    local_40 = (double *)google::protobuf::internal::ReadTag((char *)local_40,&local_34,0);
    tag_00 = local_34;
    uVar4 = local_34 >> 3;
    cVar5 = (char)local_34;
    if (uVar4 == 0x3c) {
      if (cVar5 != -0x1e) goto LAB_0028dcf1;
      psVar3 = _internal_mutable_bytesvalue_abi_cxx11_(this);
      local_40 = (double *)
                 google::protobuf::internal::InlineGreedyStringParser(psVar3,(char *)local_40,ctx);
    }
    else {
      if (uVar4 == 0x14) {
        if (cVar5 == -0x5e) {
          psVar3 = _internal_mutable_stringvalue_abi_cxx11_(this);
          local_40 = (double *)
                     google::protobuf::internal::InlineGreedyStringParser
                               (psVar3,(char *)local_40,ctx);
          bVar1 = google::protobuf::internal::VerifyUTF8(psVar3,(char *)0x0);
          if (!bVar1) {
            return (char *)0x0;
          }
          goto joined_r0x0028dcc9;
        }
      }
      else if (uVar4 == 0x1e) {
        if (cVar5 == -0x10) {
          value = google::protobuf::internal::ReadVarint32((char **)&local_40);
          _internal_set_intvalue(this,value);
          goto joined_r0x0028dcc9;
        }
      }
      else if (uVar4 == 0x28) {
        if (cVar5 == '@') {
          uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_40);
          _internal_set_longvalue(this,uVar2);
          goto joined_r0x0028dcc9;
        }
      }
      else if (uVar4 == 0x32) {
        if (cVar5 == -0x70) {
          uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_40);
          _internal_set_boolvalue(this,uVar2 != 0);
          goto joined_r0x0028dcc9;
        }
      }
      else if ((uVar4 == 10) && (cVar5 == 'Q')) {
        _internal_set_doublevalue(this,*local_40);
        local_40 = local_40 + 1;
        goto LAB_0028dbb9;
      }
LAB_0028dcf1:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        if (local_40 == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return (char *)local_40;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>
                          (&(this->super_MessageLite)._internal_metadata_);
      local_40 = (double *)
                 google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_40,ctx);
    }
joined_r0x0028dcc9:
    if (local_40 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CustomModel_CustomModelParamValue::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double doubleValue = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 81)) {
          _internal_set_doublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // string stringValue = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_stringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intValue = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 240)) {
          _internal_set_intvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 longValue = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 64)) {
          _internal_set_longvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool boolValue = 50;
      case 50:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 144)) {
          _internal_set_boolvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bytes bytesValue = 60;
      case 60:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 226)) {
          auto str = _internal_mutable_bytesvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}